

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  model_def_t *mdef_00;
  int iVar1;
  uint32 uVar2;
  segdmp_type_t sVar3;
  cmd_ln_t *pcVar4;
  char *pcVar5;
  long lVar6;
  FILE *pFVar7;
  uint32 *puVar8;
  uint32 *puVar9;
  char **ppcVar10;
  ulong uVar11;
  ulong uVar12;
  segdmp_type_t *in_R9;
  char *pcVar13;
  lexicon_t *plVar14;
  uint32 *n_seg;
  feat_t *feat;
  model_def_t *mdef;
  lexicon_t *lex;
  int32 *cb2mllr;
  uint32 *ts2cb;
  segdmp_type_t in_stack_ffffffffffffff48;
  uint32 *local_90;
  uint32 **local_88;
  feat_t *local_80;
  model_def_t *local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  char *local_68;
  lexicon_t *local_60;
  uint32 local_54;
  lexicon_t *local_50;
  char **local_48;
  int32 *local_40;
  uint32 *local_38;
  
  parse_cmd_ln(argc,argv);
  iVar1 = initialize(&local_60,&local_78,&local_80,&local_38,&local_40,in_R9);
  if (iVar1 != 0) goto LAB_00105e1a;
  pcVar4 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar4,"-segtype");
  iVar1 = strcmp(pcVar5,"all");
  if (iVar1 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
            ,0x1ab,"Writing frames to one file\n");
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-segdmpfn");
    pcVar4 = cmd_ln_get();
    sVar3 = 0x1217cb;
    lVar6 = cmd_ln_int_r(pcVar4,"-stride");
    iVar1 = agg_all_seg(local_80,sVar3,pcVar5,(uint32)lVar6);
    if (iVar1 == 0) {
      return 0;
    }
    goto LAB_00105e1a;
  }
  if (((*pcVar5 == 's') && (pcVar5[1] == 't')) && (pcVar5[2] == '\0')) {
    pcVar4 = cmd_ln_get();
    lVar6 = cmd_ln_int_r(pcVar4,"-cachesz");
    segdmp_set_bufsz((uint32)lVar6);
    pcVar4 = cmd_ln_get();
    ppcVar10 = cmd_ln_str_list_r(pcVar4,"-segdmpdirs");
    pcVar4 = cmd_ln_get();
    local_88 = (uint32 **)cmd_ln_str_r(pcVar4,"-segdmpfn");
    pcVar4 = cmd_ln_get();
    local_68 = cmd_ln_str_r(pcVar4,"-segidxfn");
    local_54 = local_78->n_tied_state;
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
    pFVar7 = fopen(pcVar5,"r");
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
    if (pFVar7 == (FILE *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x12f,"Count file %s not found; creating.\n",pcVar5);
      puVar8 = cnt_st_seg(local_78,local_60);
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x132,"Writing %s.\n",pcVar5);
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      pFVar7 = fopen(pcVar5,"w");
      if (local_78->n_tied_state != 0) {
        uVar11 = 0;
        do {
          fprintf(pFVar7,"%u\n",(ulong)puVar8[uVar11]);
          uVar11 = uVar11 + 1;
        } while (uVar11 < local_78->n_tied_state);
      }
LAB_00105fc3:
      fclose(pFVar7);
      exit(0);
    }
    uVar11 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
            ,0x13d,"Reading %s\n",pcVar5);
    puVar8 = (uint32 *)
             __ckd_calloc__((ulong)local_78->n_tied_state,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                            ,0x13e);
    plVar14 = local_60;
    if (local_78->n_tied_state != 0) {
      local_50 = local_60;
      uVar11 = 0;
      puVar9 = puVar8;
      local_48 = ppcVar10;
      do {
        iVar1 = __isoc99_fscanf(pFVar7,"%u",puVar9);
        if (iVar1 != 1) {
          pcVar4 = cmd_ln_get();
          pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
          lVar6 = 0x142;
LAB_00105e0b:
          err_msg_system(ERR_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                         ,lVar6,"Error reading count file %s",pcVar5);
          goto LAB_00105e1a;
        }
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + 1;
        ppcVar10 = local_48;
        plVar14 = local_50;
      } while (uVar11 < local_78->n_tied_state);
    }
    local_90 = (uint32 *)CONCAT44(local_90._4_4_,(int)uVar11);
    iVar1 = __isoc99_fscanf(pFVar7,"%u");
    if (iVar1 == -1) {
      fclose(pFVar7);
      uVar2 = local_80->n_sv;
      if (uVar2 == 0) {
        uVar2 = local_80->n_stream;
      }
      if (local_80->lda == (mfcc_t ***)0x0) {
        puVar9 = local_80->sv_len;
        if (puVar9 == (uint32 *)0x0) {
          puVar9 = local_80->stream_len;
        }
      }
      else {
        puVar9 = &local_80->out_dim;
      }
      sVar3 = SEGDMP_TYPE_VQ;
      iVar1 = segdmp_open_write(ppcVar10,(char *)local_88,local_68,local_54,puVar8,(uint32 **)0x0,
                                in_stack_ffffffffffffff48,uVar2,puVar9,local_80->out_dim);
      if (iVar1 == 0) {
        iVar1 = agg_st_seg(local_78,plVar14,local_80,local_38,local_40,sVar3);
LAB_00105bc7:
        if (iVar1 == 0) {
          segdmp_close();
          return 0;
        }
        goto LAB_00105e1a;
      }
      pcVar5 = "Unable to initialize segment dump\n";
      lVar6 = 0x1c1;
    }
    else {
      pcVar5 = "Expected EOF on count file, but remaining data found\n";
      lVar6 = 0x146;
    }
  }
  else {
    iVar1 = strcmp(pcVar5,"phn");
    if (iVar1 == 0) {
      pcVar4 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar4,"-cachesz");
      segdmp_set_bufsz((uint32)lVar6);
      plVar14 = local_60;
      mdef_00 = local_78;
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      pFVar7 = fopen(pcVar5,"r");
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      if (pFVar7 == (FILE *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x15d,"Count file %s not found; creating.\n",pcVar5);
        cnt_phn_seg(mdef_00,plVar14,&local_90,(uint32 ***)&local_70);
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x160,"Writing %s.\n",pcVar5);
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
        pFVar7 = fopen(pcVar5,"w");
        uVar2 = acmod_set_n_acmod(mdef_00->acmod_set);
        if (uVar2 != 0) {
          uVar11 = 0;
          do {
            fprintf(pFVar7,"%u",(ulong)local_90[uVar11]);
            if (local_90[uVar11] != 0) {
              uVar12 = 0;
              do {
                fprintf(pFVar7," %u",
                        (ulong)*(uint *)(*(long *)(CONCAT44(uStack_6c,local_70) + uVar11 * 8) +
                                        uVar12 * 4));
                uVar12 = uVar12 + 1;
              } while (uVar12 < local_90[uVar11]);
            }
            fputc(10,pFVar7);
            uVar11 = uVar11 + 1;
            uVar2 = acmod_set_n_acmod(mdef_00->acmod_set);
          } while (uVar11 < uVar2);
        }
        goto LAB_00105fc3;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x16f,"Reading %s\n",pcVar5);
      uVar2 = acmod_set_n_acmod(mdef_00->acmod_set);
      pcVar5 = (char *)(ulong)uVar2;
      puVar8 = (uint32 *)
               __ckd_calloc__((size_t)pcVar5,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                              ,0x173);
      local_90 = puVar8;
      local_88 = (uint32 **)
                 __ckd_calloc__((size_t)pcVar5,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                                ,0x174);
      local_70 = 0;
      if (uVar2 != 0) {
        pcVar13 = (char *)0x0;
        local_68 = pcVar5;
        do {
          iVar1 = __isoc99_fscanf(pFVar7,"%u",puVar8 + (long)pcVar13);
          if (iVar1 != 1) {
            pcVar4 = cmd_ln_get();
            pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
            lVar6 = 0x179;
            goto LAB_00105e0b;
          }
          uVar11 = (ulong)puVar8[(long)pcVar13];
          if (uVar11 != 0) {
            puVar9 = (uint32 *)
                     __ckd_calloc__(uVar11,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                                    ,0x17d);
            puVar8 = local_90;
            local_88[(long)pcVar13] = puVar9;
            if (local_90[(long)pcVar13] != 0) {
              lVar6 = 0;
              uVar11 = 0;
              do {
                iVar1 = __isoc99_fscanf(pFVar7,"%u",(long)local_88[(long)pcVar13] + lVar6);
                if (iVar1 != 1) {
                  pcVar4 = cmd_ln_get();
                  pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
                  lVar6 = 0x182;
                  goto LAB_00105e0b;
                }
                uVar11 = uVar11 + 1;
                lVar6 = lVar6 + 4;
                pcVar5 = local_68;
              } while (uVar11 < puVar8[(long)pcVar13]);
            }
          }
          pcVar13 = pcVar13 + 1;
          local_70 = SUB84(pcVar13,0);
        } while (pcVar13 != pcVar5);
      }
      iVar1 = __isoc99_fscanf(pFVar7,"%u",&local_70);
      if (iVar1 == -1) {
        fclose(pFVar7);
        pcVar4 = cmd_ln_get();
        ppcVar10 = cmd_ln_str_list_r(pcVar4,"-segdmpdirs");
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-segdmpfn");
        pcVar4 = cmd_ln_get();
        pcVar13 = cmd_ln_str_r(pcVar4,"-segidxfn");
        sVar3 = acmod_set_n_acmod(local_78->acmod_set);
        uVar2 = local_80->n_sv;
        if (uVar2 == 0) {
          uVar2 = local_80->n_stream;
        }
        if (local_80->lda == (mfcc_t ***)0x0) {
          puVar9 = local_80->sv_len;
          if (puVar9 == (uint32 *)0x0) {
            puVar9 = local_80->stream_len;
          }
        }
        else {
          puVar9 = &local_80->out_dim;
        }
        iVar1 = segdmp_open_write(ppcVar10,pcVar5,pcVar13,sVar3,puVar8,local_88,
                                  in_stack_ffffffffffffff48,uVar2,puVar9,local_80->out_dim);
        if (iVar1 == 0) {
          iVar1 = agg_phn_seg(local_60,local_78->acmod_set,local_80,sVar3);
          goto LAB_00105bc7;
        }
        pcVar5 = "Unable to initialize segment dump\n";
        lVar6 = 0x1d9;
      }
      else {
        pcVar5 = "Expected EOF on count file, but remaining data found\n";
        lVar6 = 0x189;
      }
    }
    else {
      iVar1 = strcmp(pcVar5,"wrd");
      if (iVar1 == 0) {
        pcVar5 = "Unimplememented -segtype wrd\n";
        lVar6 = 0x1e3;
      }
      else {
        iVar1 = strcmp(pcVar5,"utt");
        if (iVar1 != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                  ,0x1e9,"Unhandled -segtype %s\n",pcVar5);
          goto LAB_00105e1a;
        }
        pcVar5 = "Unimplememented -segtype utt\n";
        lVar6 = 0x1e6;
      }
    }
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
          ,lVar6,pcVar5);
LAB_00105e1a:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    lexicon_t *lex;
    model_def_t *mdef;
    feat_t *feat;
    const char *segtype;
    segdmp_type_t dmp_type;
    uint32 *n_seg;
    uint32 **n_frame;
    uint32 *ts2cb;
    int32 *cb2mllr;
    /*eov*/

    parse_cmd_ln(argc, argv);

    if (initialize(&lex, &mdef, &feat, &ts2cb, &cb2mllr, &dmp_type) != S3_SUCCESS) {
	exit(1);
    }

    segtype = cmd_ln_str("-segtype");

    if (strcmp(segtype, "all") == 0) {
	E_INFO("Writing frames to one file\n");

	if (agg_all_seg(feat,
			dmp_type,
			cmd_ln_str("-segdmpfn"),
			cmd_ln_int32("-stride")) != S3_SUCCESS) {
	    exit(1);
	}
    }
    else if (strcmp(segtype, "st") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      mdef->n_tied_state,
			      cnt_st(mdef, lex),
			      NULL,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_st_seg(mdef, lex, feat, ts2cb, cb2mllr, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "phn") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	cnt_phn(mdef, lex, &n_seg, &n_frame);

	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      acmod_set_n_acmod(mdef->acmod_set),
			      n_seg,
			      n_frame,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_phn_seg(lex, mdef->acmod_set, feat, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "wrd") == 0) {
	E_FATAL("Unimplememented -segtype wrd\n");
    }
    else if (strcmp(segtype, "utt") == 0) {
	E_FATAL("Unimplememented -segtype utt\n");
    }
    else {
	E_FATAL("Unhandled -segtype %s\n", segtype);
    }

    return 0;
}